

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexAuto(void)

{
  bool bVar1;
  aint aVar2;
  aint bankNum;
  aint local_18;
  aint toI;
  aint fromI;
  int iStack_c;
  bool optionals [2];
  aint autoArgs [2];
  
  if (nex.canAppend) {
    if (nex.lastBankIndex == 0x6f) {
      Error("[SAVENEX] all banks are already stored",(char *)0x0,SUPPRESS);
    }
    else {
      fromI = getNexBankNum(nex.lastBankIndex + 1);
      iStack_c = 0x6f;
      toI._2_2_ = 0x101;
      bVar1 = getIntArguments<2>(&lp,(aint (*) [2])&fromI,(bool (*) [2])((long)&toI + 2));
      if ((((bVar1) && (-1 < fromI)) && (fromI < 0x70)) && ((-1 < iStack_c && (iStack_c < 0x70)))) {
        local_18 = getNexBankIndex(fromI);
        aVar2 = getNexBankIndex(iStack_c);
        if (aVar2 < local_18) {
          Error("[SAVENEX] \'toBank\' is less than \'fromBank\'",bp,SUPPRESS);
        }
        else {
          for (; local_18 <= aVar2; local_18 = local_18 + 1) {
            bankNum = getNexBankNum(local_18);
            bVar1 = saveBank(local_18,bankNum,true);
            if (!bVar1) {
              return;
            }
          }
        }
      }
      else {
        Error("[SAVENEX] expected syntax is AUTO [<fromBank 0..111>[,<toBank 0..111>]]",bp,SUPPRESS)
        ;
      }
    }
  }
  else {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
  }
  return;
}

Assistant:

static void dirNexAuto() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	if (SNexHeader::MAX_BANK-1 == nex.lastBankIndex) {	// actually there's nothing left to scan
		Error("[SAVENEX] all banks are already stored", NULL, SUPPRESS);
		return;
	}
	// parse arguments
	aint autoArgs[2] = { getNexBankNum(nex.lastBankIndex+1), SNexHeader::MAX_BANK-1 };
	const bool optionals[] = {true, true};
	if (!getIntArguments<2>(lp, autoArgs, optionals)
			|| autoArgs[0] < 0 || SNexHeader::MAX_BANK <= autoArgs[0]
			|| autoArgs[1] < 0 || SNexHeader::MAX_BANK <= autoArgs[1]) {
		Error("[SAVENEX] expected syntax is AUTO [<fromBank 0..111>[,<toBank 0..111>]]", bp, SUPPRESS);
		return;
	}
	// validate arguments
	aint fromI = getNexBankIndex(autoArgs[0]), toI = getNexBankIndex(autoArgs[1]);
	if (toI < fromI) {
		Error("[SAVENEX] 'toBank' is less than 'fromBank'", bp, SUPPRESS);
		return;
	}
	while (fromI <= toI) {
		if (!saveBank(fromI, getNexBankNum(fromI), true)) return;
		++fromI;
	}
}